

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packing.cpp
# Opt level: O0

int __thiscall ncnn::Packing::forward(Packing *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  Mat *pMVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  Mat *in_RDX;
  Mat *in_RSI;
  size_t in_RDI;
  uchar *elem_ptr_1;
  uchar *ptr_1;
  Mat m;
  int srck_1;
  int srcq;
  int k_1;
  uchar *out_elem_ptr_1;
  int j_1;
  uchar *outptr_1;
  int i_1;
  Mat out;
  int q;
  size_t lane_size_1;
  size_t out_elemsize_2;
  int outc;
  uchar *elem_ptr;
  uchar *ptr;
  int srck;
  int srcy;
  int k;
  uchar *out_elem_ptr;
  int j;
  uchar *outptr;
  int i;
  size_t lane_size;
  size_t out_elemsize_1;
  int outh;
  size_t out_elemsize;
  int outw;
  size_t elemsize;
  int dims;
  int channels;
  int h;
  int w;
  int elempack;
  Mat *in_stack_fffffffffffffe50;
  Mat *in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe68;
  int _w;
  Mat *in_stack_fffffffffffffe70;
  Allocator *in_stack_fffffffffffffe80;
  int local_13c;
  int local_130;
  int local_114;
  Mat local_110;
  int local_cc;
  ulong local_c8;
  ulong local_c0;
  int local_b4;
  uchar *local_b0;
  uchar *local_a8;
  int local_9c;
  int local_98;
  int local_94;
  uchar *local_90;
  int local_84;
  uchar *local_80;
  int local_74;
  ulong local_70;
  ulong local_68;
  int local_5c;
  long local_58;
  int local_4c;
  ulong local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  Mat *local_20;
  Mat *local_18;
  int local_4;
  
  local_2c = in_RSI->elempack;
  if (local_2c == *(int *)(in_RDI + 0x80)) {
    Mat::operator=(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    return 0;
  }
  local_30 = in_RSI->w;
  local_34 = in_RSI->h;
  local_38 = in_RSI->c;
  local_3c = in_RSI->dims;
  local_48 = in_RSI->elemsize;
  if (*(int *)(in_RDI + 0x84) == 0) {
    if ((local_3c == 1) && ((local_30 * local_2c) % *(int *)(in_RDI + 0x80) != 0)) {
      Mat::operator=(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
      return 0;
    }
    if ((local_3c == 2) && ((local_34 * local_2c) % *(int *)(in_RDI + 0x80) != 0)) {
      Mat::operator=(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
      return 0;
    }
    if ((local_3c == 3) && ((local_38 * local_2c) % *(int *)(in_RDI + 0x80) != 0)) {
      Mat::operator=(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
      return 0;
    }
  }
  iVar5 = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  _w = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (local_3c == 1) {
    if (*(int *)(in_RDI + 0x80) == 1) {
      Mat::operator=(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
      local_20->w = local_30 * local_2c;
      local_20->cstep = (long)(local_30 * local_2c);
      local_20->elemsize = local_48 / (ulong)(long)local_2c;
      local_20->elempack = *(int *)(in_RDI + 0x80);
      local_4 = 0;
    }
    else {
      local_4c = (local_30 * local_2c + *(int *)(in_RDI + 0x80) + -1) / *(int *)(in_RDI + 0x80);
      local_58 = (local_48 / (ulong)(long)local_2c) * (long)*(int *)(in_RDI + 0x80);
      Mat::create(in_stack_fffffffffffffe70,_w,in_RDI,iVar5,(Allocator *)in_stack_fffffffffffffe50);
      bVar1 = Mat::empty(in_stack_fffffffffffffe50);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        memcpy(local_20->data,local_18->data,(long)local_30 * local_48);
        local_4 = 0;
      }
    }
  }
  else if (local_3c == 2) {
    local_5c = (local_34 * local_2c + *(int *)(in_RDI + 0x80) + -1) / *(int *)(in_RDI + 0x80);
    local_68 = (local_48 / (ulong)(long)local_2c) * (long)*(int *)(in_RDI + 0x80);
    local_70 = local_68 / (ulong)(long)*(int *)(in_RDI + 0x80);
    Mat::create(in_stack_fffffffffffffe70,_w,(int)in_stack_fffffffffffffe68,in_RDI,iVar5,
                (Allocator *)in_stack_fffffffffffffe50);
    bVar1 = Mat::empty(in_stack_fffffffffffffe50);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      for (local_74 = 0; local_74 < local_5c; local_74 = local_74 + 1) {
        local_80 = Mat::operator_cast_to_unsigned_char_(local_20);
        local_80 = local_80 + (long)(local_74 * local_30) * local_68;
        for (local_84 = 0; local_84 < local_30; local_84 = local_84 + 1) {
          local_90 = local_80 + (long)local_84 * local_68;
          for (local_94 = 0;
              (local_94 < *(int *)(in_RDI + 0x80) &&
              (local_98 = (local_74 * *(int *)(in_RDI + 0x80) + local_94) / local_2c,
              local_98 < local_34)); local_94 = local_94 + 1) {
            local_9c = (local_74 * *(int *)(in_RDI + 0x80) + local_94) % local_2c;
            local_a8 = Mat::operator_cast_to_unsigned_char_(local_18);
            local_a8 = local_a8 + (long)(local_98 * local_30) * local_48;
            local_b0 = local_a8 + (long)local_84 * local_48;
            memcpy(local_90 + (long)local_94 * local_70,local_b0 + (long)local_9c * local_70,
                   local_70);
          }
        }
      }
      local_4 = 0;
    }
  }
  else if (local_3c == 3) {
    local_b4 = (local_38 * local_2c + *(int *)(in_RDI + 0x80) + -1) / *(int *)(in_RDI + 0x80);
    local_c0 = (local_48 / (ulong)(long)local_2c) * (long)*(int *)(in_RDI + 0x80);
    local_c8 = local_c0 / (ulong)(long)*(int *)(in_RDI + 0x80);
    Mat::create(in_stack_fffffffffffffe70,_w,(int)in_stack_fffffffffffffe68,(int)(in_RDI >> 0x20),
                (size_t)in_stack_fffffffffffffe58,(int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                in_stack_fffffffffffffe80);
    bVar1 = Mat::empty(in_stack_fffffffffffffe50);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      for (local_cc = 0; local_cc < local_b4; local_cc = local_cc + 1) {
        Mat::channel(in_stack_fffffffffffffe58,(int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
        for (local_114 = 0; local_114 < local_34; local_114 = local_114 + 1) {
          pMVar2 = (Mat *)Mat::operator_cast_to_unsigned_char_(&local_110);
          lVar3 = (long)(local_114 * local_30) * local_c0;
          in_stack_fffffffffffffe58 = pMVar2;
          for (local_130 = 0; local_130 < local_30; local_130 = local_130 + 1) {
            lVar4 = (long)local_130 * local_c0;
            for (local_13c = 0;
                (local_13c < *(int *)(in_RDI + 0x80) &&
                ((local_cc * *(int *)(in_RDI + 0x80) + local_13c) / local_2c < local_38));
                local_13c = local_13c + 1) {
              iVar5 = (local_cc * *(int *)(in_RDI + 0x80) + local_13c) % local_2c;
              Mat::channel(in_stack_fffffffffffffe58,(int)((ulong)in_stack_fffffffffffffe50 >> 0x20)
                          );
              in_stack_fffffffffffffe50 =
                   (Mat *)Mat::operator_cast_to_unsigned_char_((Mat *)&stack0xfffffffffffffe78);
              memcpy((uchar *)((long)&pMVar2->data + (long)local_13c * local_c8 + lVar4 + lVar3),
                     (uchar *)((long)&in_stack_fffffffffffffe50->data +
                              (long)iVar5 * local_c8 +
                              (long)local_130 * local_48 + (long)(local_114 * local_30) * local_48),
                     local_c8);
              Mat::~Mat((Mat *)0x1c51f3);
            }
          }
        }
        Mat::~Mat((Mat *)0x1c5260);
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Packing::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elempack = bottom_blob.elempack;

    if (elempack == out_elempack)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    if (!use_padding)
    {
        // identity if use_padding not allowed
        if (dims == 1 && w * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if (dims == 2 && h * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if (dims == 3 && channels * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }

    if (dims == 1)
    {
        if (out_elempack == 1)
        {
            top_blob = bottom_blob;
            top_blob.w = w * elempack;
            top_blob.cstep = w * elempack;
            top_blob.elemsize = elemsize / elempack;
            top_blob.elempack = out_elempack;
            return 0;
        }

        int outw = (w * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        memcpy(top_blob.data, bottom_blob.data, w * elemsize);

        return 0;
    }

    if (dims == 2)
    {
        int outh = (h * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for
        for (int i = 0; i < outh; i++)
        {
            unsigned char* outptr = (unsigned char*)top_blob + i * w * out_elemsize;

            for (int j = 0; j < w; j++)
            {
                unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                for (int k = 0; k < out_elempack; k++)
                {
                    int srcy = (i * out_elempack + k) / elempack;
                    if (srcy >= h)
                        break;

                    int srck = (i * out_elempack + k) % elempack;

                    const unsigned char* ptr = (const unsigned char*)bottom_blob + srcy * w * elemsize;
                    const unsigned char* elem_ptr = ptr + j * elemsize;

                    memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                }
            }
        }

        return 0;
    }

    if (dims == 3)
    {
        int outc = (channels * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for
        for (int q = 0; q < outc; q++)
        {
            Mat out = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                unsigned char* outptr = (unsigned char*)out + i * w * out_elemsize;

                for (int j = 0; j < w; j++)
                {
                    unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                    for (int k = 0; k < out_elempack; k++)
                    {
                        int srcq = (q * out_elempack + k) / elempack;
                        if (srcq >= channels)
                            break;

                        int srck = (q * out_elempack + k) % elempack;

                        const Mat m = bottom_blob.channel(srcq);
                        const unsigned char* ptr = (const unsigned char*)m + i * w * elemsize;
                        const unsigned char* elem_ptr = ptr + j * elemsize;

                        memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                    }
                }
            }
        }

        return 0;
    }

    return 0;
}